

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O1

void __thiscall Assimp::ObjFile::Material::Material(Material *this)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 0;
  (this->MaterialName).length = 0;
  (this->MaterialName).data[0] = '\0';
  memset((this->MaterialName).data + 1,0x1b,0x3ff);
  (this->texture).length = 0;
  (this->texture).data[0] = '\0';
  memset((this->texture).data + 1,0x1b,0x3ff);
  (this->textureSpecular).length = 0;
  (this->textureSpecular).data[0] = '\0';
  memset((this->textureSpecular).data + 1,0x1b,0x3ff);
  (this->textureAmbient).length = 0;
  (this->textureAmbient).data[0] = '\0';
  memset((this->textureAmbient).data + 1,0x1b,0x3ff);
  (this->textureEmissive).length = 0;
  (this->textureEmissive).data[0] = '\0';
  memset((this->textureEmissive).data + 1,0x1b,0x3ff);
  (this->textureBump).length = 0;
  (this->textureBump).data[0] = '\0';
  memset((this->textureBump).data + 1,0x1b,0x3ff);
  (this->textureNormal).length = 0;
  (this->textureNormal).data[0] = '\0';
  memset((this->textureNormal).data + 1,0x1b,0x3ff);
  do {
    pcVar1 = this->textureReflection[0].data + lVar2 + -4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    this->textureReflection[0].data[lVar2] = '\0';
    memset(this->textureReflection[0].data + lVar2 + 1,0x1b,0x3ff);
    lVar2 = lVar2 + 0x404;
  } while (lVar2 != 0x1818);
  (this->textureSpecularity).length = 0;
  (this->textureSpecularity).data[0] = '\0';
  memset((this->textureSpecularity).data + 1,0x1b,0x3ff);
  (this->textureOpacity).length = 0;
  (this->textureOpacity).data[0] = '\0';
  memset((this->textureOpacity).data + 1,0x1b,0x3ff);
  (this->textureDisp).length = 0;
  (this->textureDisp).data[0] = '\0';
  memset((this->textureDisp).data + 1,0x1b,0x3ff);
  (this->ambient).r = 0.0;
  (this->ambient).g = 0.0;
  *(undefined8 *)&(this->ambient).b = 0x3f19999a00000000;
  (this->diffuse).g = 0.6;
  (this->diffuse).b = 0.6;
  (this->specular).r = 0.0;
  (this->specular).g = 0.0;
  *(undefined8 *)&(this->specular).b = 0;
  (this->emissive).g = 0.0;
  (this->emissive).b = 0.0;
  this->alpha = 1.0;
  this->shineness = 0.0;
  this->illumination_model = 1;
  this->ior = 1.0;
  (this->transparent).r = 1.0;
  (this->transparent).g = 1.0;
  (this->transparent).b = 1.0;
  this->clamp[0] = false;
  this->clamp[1] = false;
  this->clamp[2] = false;
  this->clamp[3] = false;
  this->clamp[4] = false;
  this->clamp[5] = false;
  this->clamp[6] = false;
  this->clamp[7] = false;
  this->clamp[8] = false;
  this->clamp[9] = false;
  this->clamp[10] = false;
  this->clamp[0xb] = false;
  this->clamp[0xc] = false;
  this->clamp[0xd] = false;
  this->clamp[0xe] = false;
  this->clamp[0xf] = false;
  return;
}

Assistant:

Material()
    :   diffuse ( ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 0.6 ) )
    ,   alpha   (ai_real( 1.0 ) )
    ,   shineness ( ai_real( 0.0) )
    ,   illumination_model (1)
    ,   ior     ( ai_real( 1.0 ) )
    ,   transparent( ai_real( 1.0), ai_real (1.0), ai_real(1.0)) {
        // empty
        for (size_t i = 0; i < TextureTypeCount; ++i) {
            clamp[ i ] = false;
        }
    }